

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void __thiscall osThread::WaitForExit(osThread *this,int32_t millisecondWaitTimeout)

{
  return;
}

Assistant:

void osThread::WaitForExit(int32_t millisecondWaitTimeout)
{
#ifdef _WIN32
    if (millisecondWaitTimeout < 0)
    {
        millisecondWaitTimeout = INFINITE;
    }
    WaitForSingleObject(Handle, millisecondWaitTimeout);
#elif __linux__
#endif
}